

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

FeatureOptions<wasm::Type> * __thiscall
wasm::Random::FeatureOptions<wasm::Type>::add<>
          (FeatureOptions<wasm::Type> *this,FeatureSet feature,WeightedOption weightedOption)

{
  mapped_type *this_00;
  size_t i;
  ulong uVar1;
  value_type local_40;
  WeightedOption weightedOption_local;
  FeatureSet feature_local;
  
  weightedOption_local.option.id = weightedOption.weight;
  local_40.id = (uintptr_t)weightedOption.option.id;
  weightedOption_local.weight._4_4_ = feature.features;
  for (uVar1 = 0; uVar1 < weightedOption_local.option.id; uVar1 = uVar1 + 1) {
    this_00 = std::
              map<wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
              ::operator[](&this->options,(key_type *)((long)&weightedOption_local.weight + 4));
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back(this_00,&local_40);
  }
  return this;
}

Assistant:

FeatureOptions<T>&
    add(FeatureSet feature, WeightedOption weightedOption, Ts... rest) {
      for (size_t i = 0; i < weightedOption.weight; i++) {
        options[feature].push_back(weightedOption.option);
      }
      return add(feature, rest...);
    }